

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<char>::write_str<char>(BasicWriter<char> *this,char *s,size_t size,AlignSpec *spec)

{
  CharPtr buffer;
  uint uVar1;
  wchar_t value;
  Alignment AVar2;
  char *pcVar3;
  char local_31;
  CharPtr pcStack_30;
  char fill;
  CharPtr out;
  AlignSpec *spec_local;
  size_t size_local;
  char *s_local;
  BasicWriter<char> *this_local;
  
  pcStack_30 = (CharPtr)0x0;
  out = (CharPtr)spec;
  spec_local = (AlignSpec *)size;
  size_local = (size_t)s;
  s_local = (char *)this;
  uVar1 = WidthSpec::width(&spec->super_WidthSpec);
  if (spec_local < (AlignSpec *)(ulong)uVar1) {
    uVar1 = WidthSpec::width((WidthSpec *)out);
    pcStack_30 = grow_buffer(this,(ulong)uVar1);
    value = WidthSpec::fill((WidthSpec *)out);
    local_31 = internal::BasicCharTraits<char>::cast(value);
    AVar2 = AlignSpec::align((AlignSpec *)out);
    pcVar3 = pcStack_30;
    if (AVar2 == ALIGN_RIGHT) {
      uVar1 = WidthSpec::width((WidthSpec *)out);
      std::uninitialized_fill_n<char*,unsigned_long,char>
                (pcVar3,(ulong)uVar1 - (long)spec_local,&local_31);
      uVar1 = WidthSpec::width((WidthSpec *)out);
      pcStack_30 = pcStack_30 + ((ulong)uVar1 - (long)spec_local);
    }
    else {
      AVar2 = AlignSpec::align((AlignSpec *)out);
      buffer = pcStack_30;
      if (AVar2 == ALIGN_CENTER) {
        uVar1 = WidthSpec::width((WidthSpec *)out);
        pcStack_30 = fill_padding(buffer,uVar1,(size_t)spec_local,(int)local_31);
      }
      else {
        pcVar3 = pcStack_30 + (long)spec_local;
        uVar1 = WidthSpec::width((WidthSpec *)out);
        std::uninitialized_fill_n<char*,unsigned_long,char>
                  (pcVar3,(ulong)uVar1 - (long)spec_local,&local_31);
      }
    }
  }
  else {
    pcStack_30 = grow_buffer(this,(size_t)spec_local);
  }
  std::uninitialized_copy<char_const*,char*>
            ((char *)size_local,(char *)((long)&(spec_local->super_WidthSpec).width_ + size_local),
             pcStack_30);
  return pcStack_30;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}